

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

void __thiscall adjMaxtrix<char>::InsertEdge(adjMaxtrix<char> *this,int v1,int v2,int weight)

{
  size_type sVar1;
  int weight_local;
  int v2_local;
  int v1_local;
  adjMaxtrix<char> *this_local;
  
  if ((((-1 < v1) &&
       (sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs), (ulong)(long)v1 < sVar1
       )) && (-1 < v2)) &&
     (sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs), (ulong)(long)v2 < sVar1))
  {
    this->edge[v2][v1] = weight;
    this->edge[v1][v2] = weight;
    this->edgeNum = this->edgeNum + 1;
    return;
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_2943);
  return;
}

Assistant:

void adjMaxtrix<dataType>::InsertEdge(int v1, int v2, int weight) {
	if (v1 < 0 || v1 >= vexs.size() || v2 < 0 || v2 >= vexs.size()) {
		cout << "插入边v1或v2越界";
		return;
	}
	edge[v1][v2] = edge[v2][v1] = weight;	//插入一条无向边
	edgeNum++;
}